

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void __thiscall
cmCPluginAPISourceFileMap::~cmCPluginAPISourceFileMap(cmCPluginAPISourceFileMap *this)

{
  cmCPluginAPISourceFile *this_00;
  bool bVar1;
  reference ppVar2;
  pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *i;
  iterator __end2;
  iterator __begin2;
  cmCPluginAPISourceFileMap *__range2;
  cmCPluginAPISourceFileMap *this_local;
  
  __end2 = std::
           map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
           ::begin(&this->
                    super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                  );
  i = (pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)
      std::
      map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
      ::end(&this->
             super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
           );
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&i);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>::
             operator*(&__end2);
    this_00 = ppVar2->second;
    if (this_00 != (cmCPluginAPISourceFile *)0x0) {
      cmCPluginAPISourceFile::~cmCPluginAPISourceFile(this_00);
      operator_delete(this_00,0xb8);
    }
    std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>::operator++
              (&__end2);
  }
  std::
  map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
  ::~map(&this->
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
        );
  return;
}

Assistant:

~cmCPluginAPISourceFileMap()
  {
    for (auto const& i : *this) {
      delete i.second;
    }
  }